

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

int countint(TValue *key,uint *nums)

{
  int iVar1;
  
  iVar1 = 0;
  if ((key->tt_ == 0x13) && ((code *)0xffffffff7fffffff < (key->value_).f + -0x80000001)) {
    iVar1 = luaO_ceillog2((key->value_).b);
    nums[iVar1] = nums[iVar1] + 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int countint (const TValue *key, unsigned int *nums) {
  unsigned int k = arrayindex(key);
  if (k != 0) {  /* is 'key' an appropriate array index? */
    nums[luaO_ceillog2(k)]++;  /* count as such */
    return 1;
  }
  else
    return 0;
}